

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<std::pair<long,_long>,_10>::Resize
          (TPZManVector<std::pair<long,_long>,_10> *this,int64_t newsize,pair<long,_long> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  pair<long,_long> *ppVar5;
  long lVar6;
  pair<long,_long> *ppVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<std::pair<long,_long>_>).fNElements;
  if (newsize != lVar9) {
    lVar8 = (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc;
    if (lVar8 < newsize) {
      if (newsize < 0xb) {
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        else {
          ppVar5 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
          lVar6 = 0;
          lVar8 = lVar9;
          do {
            puVar1 = (undefined8 *)((long)&ppVar5->first + lVar6);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)&this->fExtAlloc[0].first + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar6 = lVar6 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar8 = newsize - lVar9;
        if (lVar8 != 0 && lVar9 <= newsize) {
          ppVar5 = this->fExtAlloc + lVar9;
          do {
            lVar9 = object->second;
            ppVar5->first = object->first;
            ppVar5->second = lVar9;
            ppVar5 = ppVar5 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        ppVar5 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
        if (ppVar5 != (pair<long,_long> *)0x0 && ppVar5 != this->fExtAlloc) {
          operator_delete__(ppVar5);
        }
        (this->super_TPZVec<std::pair<long,_long>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc = 10;
      }
      else {
        dVar11 = (double)lVar8 * 1.2;
        uVar10 = (long)dVar11;
        if (dVar11 < (double)newsize) {
          uVar10 = newsize;
        }
        ppVar5 = (pair<long,_long> *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar10 << 4);
        if (uVar10 != 0) {
          memset(ppVar5,0,uVar10 << 4);
        }
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        else {
          ppVar7 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
          lVar6 = 0;
          lVar8 = lVar9;
          do {
            puVar1 = (undefined8 *)((long)&ppVar7->first + lVar6);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)&ppVar5->first + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar6 = lVar6 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar8 = newsize - lVar9;
        if (lVar8 != 0 && lVar9 <= newsize) {
          lVar6 = object->first;
          lVar4 = object->second;
          ppVar7 = ppVar5 + lVar9;
          do {
            ppVar7->first = lVar6;
            ppVar7->second = lVar4;
            ppVar7 = ppVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        ppVar7 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
        if (ppVar7 != (pair<long,_long> *)0x0 && ppVar7 != this->fExtAlloc) {
          operator_delete__(ppVar7);
        }
        (this->super_TPZVec<std::pair<long,_long>_>).fStore = ppVar5;
        (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc = uVar10;
      }
    }
    else {
      lVar8 = newsize - lVar9;
      if (lVar8 != 0 && lVar9 <= newsize) {
        ppVar5 = (this->super_TPZVec<std::pair<long,_long>_>).fStore + lVar9;
        do {
          lVar9 = object->second;
          ppVar5->first = object->first;
          ppVar5->second = lVar9;
          ppVar5 = ppVar5 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}